

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O1

bool __thiscall clipp::group::depth_first_traverser::is_inside(depth_first_traverser *this,group *g)

{
  context *pcVar1;
  __normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
  _Var2;
  bool bVar3;
  
  if (g == (group *)0x0) {
    bVar3 = false;
  }
  else {
    pcVar1 = (this->stack_).
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<clipp::group::depth_first_traverser::context_const*,std::vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>>,__gnu_cxx::__ops::_Iter_pred<clipp::group::depth_first_traverser::is_inside(clipp::group_const*)const::_lambda(clipp::group::depth_first_traverser::context_const&)_1_>>
                      ((this->stack_).
                       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                       ._M_impl.super__Vector_impl_data._M_start,pcVar1,g);
    bVar3 = _Var2._M_current != pcVar1;
  }
  return bVar3;
}

Assistant:

bool is_inside(const group* g) const noexcept {
            if(!g) return false;
            return std::any_of(stack_.begin(), stack_.end(),
                [g](const context& c) { return c.parent == g; });
        }